

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::ParseEnum(Parser *this,bool is_union)

{
  bool bVar1;
  int iVar2;
  EnumDef *this_00;
  SymbolTable<flatbuffers::EnumVal> *this_01;
  EnumVal *pEVar3;
  size_type sVar4;
  reference ppEVar5;
  StructDef *pSVar6;
  char *__nptr;
  int local_1ec;
  allocator local_199;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  EnumVal *local_158;
  EnumVal *ev;
  size_type prevsize;
  string dc_1;
  string name_1;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  EnumDef *local_70;
  EnumDef *enum_def;
  string name;
  string local_38 [8];
  string dc;
  bool is_union_local;
  Parser *this_local;
  
  dc.field_2._M_local_buf[0xf] = is_union;
  std::__cxx11::string::string(local_38,(string *)&this->doc_comment_);
  Next(this);
  std::__cxx11::string::string((string *)&enum_def,(string *)&this->attribute_);
  Expect(this,4);
  this_00 = (EnumDef *)operator_new(0xf8);
  EnumDef::EnumDef(this_00);
  local_70 = this_00;
  std::__cxx11::string::operator=((string *)this_00,(string *)&enum_def);
  std::__cxx11::string::operator=((string *)&(local_70->super_Definition).doc_comment,local_38);
  local_70->is_union = (bool)(dc.field_2._M_local_buf[0xf] & 1);
  bVar1 = SymbolTable<flatbuffers::EnumDef>::Add(&this->enums_,(string *)&enum_def,local_70);
  if (bVar1) {
    std::operator+(&local_90,"enum already exists: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enum_def);
    Error(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((dc.field_2._M_local_buf[0xf] & 1U) == 0) {
    bVar1 = IsNext(this,0x3a);
    if (bVar1) {
      ParseType(this,&local_70->underlying_type);
      bVar1 = IsInteger((local_70->underlying_type).base_type);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b0,"underlying enum type must be integral",&local_b1);
        Error(&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
    }
    else {
      (local_70->underlying_type).base_type = BASE_TYPE_SHORT;
    }
  }
  else {
    (local_70->underlying_type).base_type = BASE_TYPE_UTYPE;
    (local_70->underlying_type).enum_def = local_70;
  }
  ParseMetaData(this,&local_70->super_Definition);
  Expect(this,0x7b);
  if ((dc.field_2._M_local_buf[0xf] & 1U) != 0) {
    this_01 = &local_70->vals;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"NONE",&local_d9);
    pEVar3 = (EnumVal *)operator_new(0x50);
    name_1.field_2._M_local_buf[0xe] = '\x01';
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_100,"NONE",(allocator *)(name_1.field_2._M_local_buf + 0xf));
    EnumVal::EnumVal(pEVar3,&local_100,0);
    name_1.field_2._M_local_buf[0xe] = '\0';
    SymbolTable<flatbuffers::EnumVal>::Add(this_01,&local_d8,pEVar3);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  do {
    std::__cxx11::string::string
              ((string *)(dc_1.field_2._M_local_buf + 8),(string *)&this->attribute_);
    std::__cxx11::string::string((string *)&prevsize,(string *)&this->doc_comment_);
    Expect(this,4);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::size
                   (&(local_70->vals).vec);
    pEVar3 = (EnumVal *)operator_new(0x50);
    sVar4 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::size
                      (&(local_70->vals).vec);
    if (sVar4 == 0) {
      local_1ec = 0;
    }
    else {
      ppEVar5 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::back
                          (&(local_70->vals).vec);
      local_1ec = (*ppEVar5)->value + 1;
    }
    EnumVal::EnumVal(pEVar3,(string *)((long)&dc_1.field_2 + 8),local_1ec);
    local_158 = pEVar3;
    bVar1 = SymbolTable<flatbuffers::EnumVal>::Add
                      (&local_70->vals,(string *)((long)&dc_1.field_2 + 8),pEVar3);
    if (bVar1) {
      std::operator+(&local_178,"enum value already exists: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&dc_1.field_2 + 8));
      Error(&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::__cxx11::string::operator=((string *)&local_158->doc_comment,(string *)&prevsize);
    if ((dc.field_2._M_local_buf[0xf] & 1U) != 0) {
      pSVar6 = LookupCreateStruct(this,(string *)((long)&dc_1.field_2 + 8));
      local_158->struct_def = pSVar6;
    }
    bVar1 = IsNext(this,0x3d);
    if (bVar1) {
      __nptr = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(__nptr);
      local_158->value = iVar2;
      Expect(this,2);
      if ((ev != (EnumVal *)0x0) &&
         (ppEVar5 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::
                    operator[](&(local_70->vals).vec,(size_type)((long)&ev[-1].struct_def + 7)),
         local_158->value <= (*ppEVar5)->value)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_198,"enum values must be specified in ascending order",
                   &local_199);
        Error(&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::allocator<char>::~allocator((allocator<char> *)&local_199);
      }
    }
    std::__cxx11::string::~string((string *)&prevsize);
    std::__cxx11::string::~string((string *)(dc_1.field_2._M_local_buf + 8));
    bVar1 = IsNext(this,0x2c);
  } while (bVar1);
  Expect(this,0x7d);
  std::__cxx11::string::~string((string *)&enum_def);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Parser::ParseEnum(bool is_union) {
  std::string dc = doc_comment_;
  Next();
  std::string name = attribute_;
  Expect(kTokenIdentifier);
  auto &enum_def = *new EnumDef();
  enum_def.name = name;
  enum_def.doc_comment = dc;
  enum_def.is_union = is_union;
  if (enums_.Add(name, &enum_def)) Error("enum already exists: " + name);
  if (is_union) {
    enum_def.underlying_type.base_type = BASE_TYPE_UTYPE;
    enum_def.underlying_type.enum_def = &enum_def;
  } else if (IsNext(':')) {
    // short is the default type for fields when you use enums,
    // though people are encouraged to pick any integer type instead.
    ParseType(enum_def.underlying_type);
    if (!IsInteger(enum_def.underlying_type.base_type))
      Error("underlying enum type must be integral");
  } else {
    enum_def.underlying_type.base_type = BASE_TYPE_SHORT;
  }
  ParseMetaData(enum_def);
  Expect('{');
  if (is_union) enum_def.vals.Add("NONE", new EnumVal("NONE", 0));
  do {
    std::string name = attribute_;
    std::string dc = doc_comment_;
    Expect(kTokenIdentifier);
    auto prevsize = enum_def.vals.vec.size();
    auto &ev = *new EnumVal(name, static_cast<int>(
                      enum_def.vals.vec.size()
                        ? enum_def.vals.vec.back()->value + 1
                        : 0));
    if (enum_def.vals.Add(name, &ev))
      Error("enum value already exists: " + name);
    ev.doc_comment = dc;
    if (is_union) {
      ev.struct_def = LookupCreateStruct(name);
    }
    if (IsNext('=')) {
      ev.value = atoi(attribute_.c_str());
      Expect(kTokenIntegerConstant);
      if (prevsize && enum_def.vals.vec[prevsize - 1]->value >= ev.value)
        Error("enum values must be specified in ascending order");
    }
  } while (IsNext(','));
  Expect('}');
}